

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  byte bVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  VoidPtr VVar2;
  bool bVar3;
  Descriptor *type;
  MessageLite *pMVar4;
  undefined8 *puVar5;
  string *psVar6;
  UnknownFieldSet *this_00;
  Nonnull<const_char_*> failure_msg;
  string_view element_name;
  string_view input;
  string_view element_name_00;
  string_view str;
  string serial;
  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  Parser parser;
  FieldDescriptor *local_d0;
  VoidPtr local_c8;
  code *pcStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  LogMessage local_a8;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  Finder local_80;
  DescriptorBuilder *local_78;
  VoidPtr local_70;
  Finder *pFStack_68;
  LogMessageFatal local_40;
  
  local_d0 = option_field;
  if ((undefined1  [80])
      ((undefined1  [80])this->uninterpreted_option_->field_0 & (undefined1  [80])0x4) ==
      (undefined1  [80])0x0) {
    local_a8._0_8_ = &local_d0;
    local_70.obj = &local_a8;
    pFStack_68 = (Finder *)
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__0,std::__cxx11::string>
    ;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.obj = local_70.obj;
    element_name._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    element_name._M_len = (this->options_to_interpret_->element_name)._M_string_length;
    AddError(this->builder_,element_name,&this->uninterpreted_option_->super_Message,OPTION_VALUE,
             make_error);
    bVar3 = false;
  }
  else {
    type = FieldDescriptor::message_type(option_field);
    pMVar4 = &DynamicMessageFactory::GetPrototype(&this->dynamic_factory_,type)->super_MessageLite;
    pMVar4 = MessageLite::New(pMVar4,(Arena *)0x0);
    if (pMVar4 == (MessageLite *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x27e0,"dynamic.get() != nullptr");
      str._M_str = "Could not create an instance of ";
      str._M_len = 0x20;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_a8,str);
      local_c8.obj = local_c8.obj & 0xffffffffff000000;
      FieldDescriptor::DebugStringWithOptions_abi_cxx11_
                ((string *)&local_70,local_d0,(DebugStringOptions *)&local_c8);
      absl::lts_20250127::log_internal::LogMessage::operator<<(&local_a8,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_a8);
    }
    local_a8._0_8_ = &PTR__AggregateErrorCollector_0084fd78;
    local_98 = 0;
    local_90 = 0;
    local_80._vptr_Finder = (_func_int **)&PTR__Finder_0084ffb0;
    local_78 = this->builder_;
    local_a8.data_._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )&local_90;
    TextFormat::Parser::Parser((Parser *)&local_70);
    pFStack_68 = &local_80;
    puVar5 = (undefined8 *)
             ((ulong)(this->uninterpreted_option_->field_0)._impl_.aggregate_value_.tagged_ptr_.ptr_
             & 0xfffffffffffffffc);
    input._M_str = (char *)*puVar5;
    input._M_len = puVar5[1];
    local_70.obj = &local_a8;
    bVar3 = TextFormat::Parser::ParseFromString((Parser *)&local_70,input,(Message *)pMVar4);
    if (bVar3) {
      local_c8.obj = &local_b8;
      pcStack_c0 = (code *)0x0;
      local_b8._M_local_buf[0] = '\0';
      MessageLite::SerializeToString(pMVar4,(string *)&local_c8);
      VVar2 = local_c8;
      bVar1 = local_d0->type_;
      if (bVar1 == 0xb) {
        psVar6 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(unknown_fields,local_d0->number_);
        std::__cxx11::string::_M_replace
                  ((ulong)psVar6,0,(char *)psVar6->_M_string_length,(ulong)VVar2);
      }
      else {
        if (bVar1 == 10) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  ((ulong)bVar1,10,
                                   "option_field->type() == FieldDescriptor::TYPE_GROUP");
        }
        if (failure_msg != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                     ,0x27f6,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
        }
        this_00 = UnknownFieldSet::AddGroup(unknown_fields,local_d0->number_);
        UnknownFieldSet::ParseFromArray(this_00,local_c8.obj,(int)pcStack_c0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.obj != &local_b8) {
        operator_delete(local_c8.obj,
                        CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1)
        ;
      }
    }
    else {
      local_40.super_LogMessage._0_8_ = &local_d0;
      local_c8.obj = &local_40;
      pcStack_c0 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__1,std::__cxx11::string>
      ;
      make_error_00.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__1,std::__cxx11::string>
      ;
      make_error_00.ptr_.obj = local_c8.obj;
      element_name_00._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      element_name_00._M_len = (this->options_to_interpret_->element_name)._M_string_length;
      local_40.super_LogMessage.data_._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                        )&local_a8;
      AddError(this->builder_,element_name_00,&this->uninterpreted_option_->super_Message,
               OPTION_VALUE,make_error_00);
    }
    TextFormat::Parser::~Parser((Parser *)&local_70);
    TextFormat::Finder::~Finder(&local_80);
    local_a8._0_8_ = &PTR__AggregateErrorCollector_0084fd78;
    if (local_a8.data_._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
         )&local_90) {
      operator_delete((void *)local_a8.data_._M_t.
                              super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                              .
                              super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                              ._M_head_impl,CONCAT71(uStack_8f,local_90) + 1);
    }
    io::ErrorCollector::~ErrorCollector((ErrorCollector *)&local_a8);
    (*pMVar4->_vptr_MessageLite[1])(pMVar4);
  }
  return bVar3;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetAggregateOption(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  if (!uninterpreted_option_->has_aggregate_value()) {
    return AddValueError([&] {
      return absl::StrCat("Option \"", option_field->full_name(),
                          "\" is a message. "
                          "To set the entire message, use syntax like \"",
                          option_field->name(),
                          " = { <proto text format> }\". "
                          "To set fields within it, use syntax like \"",
                          option_field->name(), ".foo = value\".");
    });
  }

  const Descriptor* type = option_field->message_type();
  std::unique_ptr<Message> dynamic(dynamic_factory_.GetPrototype(type)->New());
  ABSL_CHECK(dynamic.get() != nullptr)
      << "Could not create an instance of " << option_field->DebugString();

  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  finder.builder_ = builder_;
  TextFormat::Parser parser;
  parser.RecordErrorsTo(&collector);
  parser.SetFinder(&finder);
  if (!parser.ParseFromString(uninterpreted_option_->aggregate_value(),
                              dynamic.get())) {
    AddValueError([&] {
      return absl::StrCat("Error while parsing option value for \"",
                          option_field->name(), "\": ", collector.error_);
    });
    return false;
  } else {
    std::string serial;
    dynamic->SerializeToString(&serial);  // Never fails
    if (option_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      unknown_fields->AddLengthDelimited(option_field->number(), serial);
    } else {
      ABSL_CHECK_EQ(option_field->type(), FieldDescriptor::TYPE_GROUP);
      UnknownFieldSet* group = unknown_fields->AddGroup(option_field->number());
      group->ParseFromString(serial);
    }
    return true;
  }
}